

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_lyb.c
# Opt level: O1

int lyb_read(char *data,uint8_t *buf,size_t count,lyb_state *lybs)

{
  uint8_t uVar1;
  int iVar2;
  size_t *psVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  
  if ((data != (char *)0x0) && (lybs != (lyb_state *)0x0)) {
    iVar9 = 0;
    while( true ) {
      uVar8 = count;
      if ((long)lybs->used < 1) {
        uVar6 = 0xffffffff;
      }
      else {
        uVar7 = 0xffffffff;
        uVar4 = 0;
        do {
          if ((lybs->written[uVar4] <= uVar8) && (lybs->position[uVar4] != 0)) {
            uVar7 = uVar4 & 0xffffffff;
            uVar8 = lybs->written[uVar4];
          }
          uVar6 = (uint)uVar7;
          uVar4 = uVar4 + 1;
        } while ((long)lybs->used != uVar4);
      }
      if ((uVar6 == 0xffffffff) && (count == 0)) break;
      if (uVar8 != 0) {
        if (buf != (uint8_t *)0x0) {
          memcpy(buf,data + iVar9,uVar8);
        }
        iVar2 = lybs->used;
        if (0 < (long)iVar2) {
          psVar3 = lybs->written;
          lVar5 = 0;
          do {
            uVar4 = psVar3[lVar5] - uVar8;
            psVar3[lVar5] = uVar4;
            if (0xff < uVar4) {
              __assert_fail("lybs->written[i] <= LYB_SIZE_MAX",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser_lyb.c"
                            ,0x52,
                            "int lyb_read(const char *, uint8_t *, size_t, struct lyb_state *)");
            }
            lVar5 = lVar5 + 1;
          } while (iVar2 != lVar5);
        }
        count = count - uVar8;
        if (buf != (uint8_t *)0x0) {
          buf = buf + uVar8;
        }
        iVar9 = iVar9 + (int)uVar8;
      }
      if (-1 < (int)uVar6) {
        uVar1 = data[(long)iVar9 + 1];
        lybs->written[uVar6] = (ulong)(byte)data[iVar9];
        lybs->inner_chunks[uVar6] = uVar1;
        lybs->position[uVar6] = (ulong)(lybs->written[uVar6] == 0xff);
        iVar9 = iVar9 + 2;
      }
    }
    return iVar9;
  }
  __assert_fail("data && lybs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser_lyb.c"
                ,0x35,"int lyb_read(const char *, uint8_t *, size_t, struct lyb_state *)");
}

Assistant:

static int
lyb_read(const char *data, uint8_t *buf, size_t count, struct lyb_state *lybs)
{
    int ret = 0, i, empty_chunk_i;
    size_t to_read;
    uint8_t meta_buf[LYB_META_BYTES];

    assert(data && lybs);

    while (1) {
        /* check for fully-read (empty) data chunks */
        to_read = count;
        empty_chunk_i = -1;
        for (i = 0; i < lybs->used; ++i) {
            /* we want the innermost chunks resolved first, so replace previous empty chunks,
             * also ignore chunks that are completely finished, there is nothing for us to do */
            if ((lybs->written[i] <= to_read) && lybs->position[i]) {
                /* empty chunk, do not read more */
                to_read = lybs->written[i];
                empty_chunk_i = i;
            }
        }

        if ((empty_chunk_i == -1) && !count) {
            break;
        }

        /* we are actually reading some data, not just finishing another chunk */
        if (to_read) {
            if (buf) {
                memcpy(buf, data + ret, to_read);
            }

            for (i = 0; i < lybs->used; ++i) {
                /* decrease all written counters */
                lybs->written[i] -= to_read;
                assert(lybs->written[i] <= LYB_SIZE_MAX);
            }
            /* decrease count/buf */
            count -= to_read;
            if (buf) {
                buf += to_read;
            }

            ret += to_read;
        }

        if (empty_chunk_i > -1) {
            /* read the next chunk meta information */
            memcpy(meta_buf, data + ret, LYB_META_BYTES);
            lybs->written[empty_chunk_i] = meta_buf[0];
            lybs->inner_chunks[empty_chunk_i] = meta_buf[1];

            /* remember whether there is a following chunk or not */
            lybs->position[empty_chunk_i] = (lybs->written[empty_chunk_i] == LYB_SIZE_MAX ? 1 : 0);

            ret += LYB_META_BYTES;
        }
    }

    return ret;
}